

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Encode(Minefield_Query_PDU *this,KDataStream *stream)

{
  pointer pPVar1;
  unsigned_short *puVar2;
  pointer pPVar3;
  unsigned_short *puVar4;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ReqID,stream);
  KDataStream::Write(stream,this->m_ui8ReqID);
  KDataStream::Write(stream,this->m_ui8NumPerimPoints);
  KDataStream::Write(stream,this->m_ui8Padding1);
  KDataStream::Write(stream,this->m_ui8NumSensTyp);
  (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DataFilter,stream);
  (*(this->m_MineTypFilter).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MineTypFilter,stream)
  ;
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pPVar3,stream);
  }
  puVar2 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    KDataStream::Write<unsigned_short>(stream,*puVar4);
  }
  if (this->m_bNeedsPadding == true) {
    KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
    return;
  }
  return;
}

Assistant:

void Minefield_Query_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_ui8ReqID
           << m_ui8NumPerimPoints
           << m_ui8Padding1
           << m_ui8NumSensTyp
           << KDIS_STREAM m_DataFilter
           << KDIS_STREAM m_MineTypFilter;

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        citrPnt->Encode( stream );
    }

    std::vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    std::vector<KUINT16>::const_iterator citrEndSt = m_vui16SensorTypes.end();
    for( ; citrSt != citrEndSt; ++citrSt )
    {
        stream << *citrSt;
    }

    if( m_bNeedsPadding )
    {
        stream << m_ui16Padding1;
    }
}